

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  ulong uVar2;
  int iVar3;
  size_t nblimbs;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  bVar9 = X == B;
  if (bVar9) {
    B = A;
  }
  if ((A != X && !bVar9) && (iVar3 = mbedtls_mpi_copy(X,A), iVar3 != 0)) {
    return iVar3;
  }
  X->s = 1;
  lVar8 = B->n * -8;
  nblimbs = B->n;
  while ((nblimbs != 0 && (B->p[nblimbs - 1] == 0))) {
    lVar8 = lVar8 + 8;
    nblimbs = nblimbs - 1;
  }
  iVar3 = mbedtls_mpi_grow(X,nblimbs);
  if (iVar3 == 0) {
    lVar8 = -lVar8;
    pmVar1 = B->p;
    puVar4 = X->p;
    uVar7 = 0;
    for (sVar5 = 0; nblimbs != sVar5; sVar5 = sVar5 + 1) {
      uVar2 = *puVar4;
      uVar6 = uVar2 + uVar7;
      *puVar4 = uVar6;
      uVar6 = uVar6 + pmVar1[sVar5];
      *puVar4 = uVar6;
      uVar7 = (ulong)(uVar6 < pmVar1[sVar5]) + (ulong)CARRY8(uVar7,uVar2);
      puVar4 = puVar4 + 1;
    }
    for (; uVar7 != 0; uVar7 = (ulong)CARRY8(uVar6,uVar7)) {
      if (X->n <= nblimbs) {
        iVar3 = mbedtls_mpi_grow(X,nblimbs + 1);
        if (iVar3 != 0) {
          return iVar3;
        }
        puVar4 = (ulong *)((long)X->p + lVar8);
      }
      uVar6 = *puVar4;
      *puVar4 = *puVar4 + uVar7;
      puVar4 = puVar4 + 1;
      lVar8 = lVar8 + 8;
      nblimbs = nblimbs + 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    for( i = 0; i < j; i++, o++, p++ )
    {
        *p +=  c; c  = ( *p <  c );
        *p += *o; c += ( *p < *o );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}